

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_internal.h
# Opt level: O0

size_t mbedtls_ssl_hs_hdr_len(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  if ((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) {
    ssl_local = (mbedtls_ssl_context *)0xc;
  }
  else {
    ssl_local = (mbedtls_ssl_context *)0x4;
  }
  return (size_t)ssl_local;
}

Assistant:

static inline size_t mbedtls_ssl_hs_hdr_len( const mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        return( 12 );
#else
    ((void) ssl);
#endif
    return( 4 );
}